

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O0

void __thiscall Player::Player(Player *this,Player *toCopy)

{
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *this_00;
  Hand *this_01;
  DiceRoller *this_02;
  int *piVar1;
  list<Observer_*,_std::allocator<Observer_*>_> *this_03;
  Player *toCopy_local;
  Player *this_local;
  
  this_00 = (vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)operator_new(0x18);
  std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::vector(this_00);
  this->pOwnedCountries = this_00;
  this_01 = (Hand *)operator_new(8);
  Hand::Hand(this_01);
  this->pCards = this_01;
  this_02 = (DiceRoller *)operator_new(0x10);
  DiceRoller::DiceRoller(this_02);
  this->pDiceRoller = this_02;
  piVar1 = (int *)operator_new(4);
  *piVar1 = *toCopy->pPlayerId;
  this->pPlayerId = piVar1;
  this_03 = (list<Observer_*,_std::allocator<Observer_*>_> *)operator_new(0x18);
  memset(this_03,0,0x18);
  std::__cxx11::list<Observer_*,_std::allocator<Observer_*>_>::list(this_03);
  this->pObservers = this_03;
  std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::operator=
            (this->pOwnedCountries,toCopy->pOwnedCountries);
  Hand::operator=(this->pCards,toCopy->pCards);
  DiceRoller::operator=(this->pDiceRoller,toCopy->pDiceRoller);
  *this->currentState = *toCopy->currentState;
  std::__cxx11::list<Observer_*,_std::allocator<Observer_*>_>::operator=
            (this->pObservers,toCopy->pObservers);
  return;
}

Assistant:

Player::Player(const Player &toCopy) {
    pOwnedCountries = new std::vector<Map::Country*>;
    pCards = new Hand();
    pDiceRoller = new DiceRoller();
    pPlayerId = new int(*toCopy.pPlayerId);
    pObservers = new std::list<Observer*>();
    *pOwnedCountries = *toCopy.pOwnedCountries;
    *pCards = *toCopy.pCards;
    *pDiceRoller = *toCopy.pDiceRoller;
    *currentState = *toCopy.currentState;
    *pObservers = *toCopy.pObservers;
}